

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_replaceRangeCString_success_indexAndRangeBeyondSize_fn(int _i)

{
  AString string_00;
  bool bVar1;
  int iVar2;
  char *in_stack_fffffffffffffeb0;
  uintmax_t _ck_y_7;
  uintmax_t _ck_x_9;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_8;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_5;
  char *_ck_x_7;
  void *_ck_x_6;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_5;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  AString string;
  int _i_local;
  
  string.buffer._4_4_ = _i;
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"0123",8);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  bVar1 = AString_replaceRangeCString((AString *)&_ck_x,4,0x29a,"45",2);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x632,
                      "Assertion \'AString_replaceRangeCString(&string, 4, 666, \"45\", 2)\' failed"
                      ,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x632);
  if (string.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x633,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (8)",
                      "(string).capacity",string.size,"(8)",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x633);
  if (string.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x633,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x633);
  _ck_y_s = (char *)string.capacity;
  if (string.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar2 = strcmp("012345",(char *)string.capacity);
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x633);
      if (string.deallocator != (ACUtilsDeallocator)0x6) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x633,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).size == strlen(\"012345\")","(string).size",string.deallocator,
                          "strlen(\"012345\")",6,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x633);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x634,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtilsTest_AString_reallocCount == (0)",
                          "private_ACUtilsTest_AString_reallocCount",
                          private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x634);
      bVar1 = AString_replaceRangeCString((AString *)&_ck_x,0x29a,0x2a,"67",2);
      if (bVar1 == false) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x635,
                          "Assertion \'AString_replaceRangeCString(&string, 666, 42, \"67\", 2)\' failed"
                          ,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x635);
      if (string.size == 8) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x636);
        if (string.capacity == 0) {
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x636,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                            "(void*) (string).buffer",0,0);
        }
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x636);
        _ck_y_s_1 = (char *)string.capacity;
        if (string.capacity == 0) {
          _ck_y_q_1 = "";
          _ck_y_s_1 = "(null)";
        }
        else {
          _ck_y_q_1 = "\"";
          iVar2 = strcmp("01234567",(char *)string.capacity);
          if (iVar2 == 0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x636);
            if (string.deallocator != (ACUtilsDeallocator)0x8) {
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x636,"Assertion \'_ck_x == _ck_y\' failed",
                                "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                "(string).size == strlen(\"01234567\")","(string).size",
                                string.deallocator,"strlen(\"01234567\")",8,0);
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x636);
            if (private_ACUtilsTest_AString_reallocCount == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x637);
              string_00.deallocator = string.deallocator;
              string_00.reallocator = string.reallocator;
              string_00.size = string.size;
              string_00.capacity = string.capacity;
              string_00.buffer = in_stack_fffffffffffffeb0;
              private_ACUtilsTest_AString_destructTestString(string_00);
              return;
            }
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x637,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "private_ACUtilsTest_AString_reallocCount == (0)",
                              "private_ACUtilsTest_AString_reallocCount",
                              private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
          }
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x636,
                          "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                          ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                          "(string).buffer == (\"01234567\")","(string).buffer",_ck_y_q_1,_ck_y_s_1,
                          _ck_y_q_1,"(\"01234567\")","\"","01234567","\"",0);
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x636,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (8)",
                        "(string).capacity",string.size,"(8)",8,0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x633,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string).buffer == (\"012345\")","(string).buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                    "(\"012345\")","\"","012345","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRangeCString_success_indexAndRangeBeyondSize)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("0123", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 4, 666, "45", 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012345", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 666, 42, "67", 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}